

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O2

btCollisionShape * __thiscall
btCollisionWorldImporter::createConeShapeX
          (btCollisionWorldImporter *this,btScalar radius,btScalar height)

{
  btCollisionShape *this_00;
  btCollisionShape *local_18;
  
  this_00 = (btCollisionShape *)btConeShape::operator_new(0x60);
  btConeShapeX::btConeShapeX((btConeShapeX *)this_00,radius,height);
  local_18 = this_00;
  btAlignedObjectArray<btCollisionShape_*>::push_back(&this->m_allocatedCollisionShapes,&local_18);
  return this_00;
}

Assistant:

btCollisionShape* btCollisionWorldImporter::createConeShapeX(btScalar radius,btScalar height)
{
	btConeShapeX* shape = new btConeShapeX(radius,height);
	m_allocatedCollisionShapes.push_back(shape);
	return shape;
}